

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBufferCopy(StringRef InputData,Twine *BufferName)

{
  Twine *in_RCX;
  StringRef InputData_00;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_28;
  byte local_18;
  
  InputData_00.Data = (char *)InputData.Length;
  InputData_00.Length = (size_t)BufferName;
  getMemBufferCopyImpl
            ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
              *)&local_28.TStorage,InputData_00,in_RCX);
  if ((local_18 & 1) != 0) {
    local_28._0_1_ = '\0';
    local_28._1_1_ = '\0';
    local_28._2_1_ = '\0';
    local_28._3_1_ = '\0';
    local_28._4_1_ = '\0';
    local_28._5_1_ = '\0';
    local_28._6_1_ = '\0';
    local_28._7_1_ = '\0';
  }
  *(undefined8 *)InputData.Data = local_28.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBufferCopy(StringRef InputData, const Twine &BufferName) {
  auto Buf = getMemBufferCopyImpl(InputData, BufferName);
  if (Buf)
    return std::move(*Buf);
  return nullptr;
}